

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrGetSpatialGraphNodeBindingPropertiesMSFT
                   (XrSpatialGraphNodeBindingMSFT nodeBinding,
                   XrSpatialGraphNodeBindingPropertiesGetInfoMSFT *getInfo,
                   XrSpatialGraphNodeBindingPropertiesMSFT *properties)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table;
  XrSpatialGraphNodeBindingMSFT nodeBinding_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  string local_358;
  string local_338;
  ostringstream oss_properties;
  uint auStack_300 [88];
  ostringstream oss_nodeBinding;
  uint auStack_188 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodeBinding_local = nodeBinding;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_nodeBinding,
             &g_spatialgraphnodebindingmsft_dispatch_mutex);
  iVar4 = std::
          _Hashtable<XrSpatialGraphNodeBindingMSFT_T_*,_std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrSpatialGraphNodeBindingMSFT_T_*>,_std::hash<XrSpatialGraphNodeBindingMSFT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_spatialgraphnodebindingmsft_dispatch_map._M_h,&nodeBinding_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_nodeBinding);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[43],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",
               (char (*) [43])"xrGetSpatialGraphNodeBindingPropertiesMSFT",(char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_nodeBinding);
    lVar1 = *(long *)((long)&_oss_nodeBinding[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_nodeBinding);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[30],char_const(&)[12],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [30])"XrSpatialGraphNodeBindingMSFT",
               (char (*) [12])"nodeBinding",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_properties)
    ;
    std::__cxx11::string::~string((string *)&oss_properties);
    if (getInfo == (XrSpatialGraphNodeBindingPropertiesGetInfoMSFT *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_properties);
      *(uint *)((long)auStack_300 + *(long *)(_oss_properties + -0x18)) =
           *(uint *)((long)auStack_300 + *(long *)(_oss_properties + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(&oss_properties);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[54],char_const(&)[8],std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)&contents,(char (*) [54])"const XrSpatialGraphNodeBindingPropertiesGetInfoMSFT*"
                 ,(char (*) [8])"getInfo",&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_properties);
    }
    else {
      std::__cxx11::string::string((string *)&local_338,"getInfo",(allocator *)&oss_properties);
      std::__cxx11::string::string
                ((string *)&local_358,"const XrSpatialGraphNodeBindingPropertiesGetInfoMSFT*",
                 (allocator *)&local_390);
      bVar2 = ApiDumpOutputXrStruct(gen_dispatch_table,getInfo,&local_338,&local_358,true,&contents)
      ;
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_338);
      if (!bVar2) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Invalid Operation");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_properties);
    *(uint *)((long)auStack_300 + *(long *)(_oss_properties + -0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(_oss_properties + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_properties);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[41],char_const(&)[11],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [41])0x214a86,(char (*) [11])"properties",&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_370,&contents);
    ApiDumpLayerRecordContent(&local_370);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_370);
    XVar3 = (*gen_dispatch_table->GetSpatialGraphNodeBindingPropertiesMSFT)
                      (nodeBinding_local,getInfo,properties);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_properties);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_nodeBinding);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrGetSpatialGraphNodeBindingPropertiesMSFT(
    XrSpatialGraphNodeBindingMSFT nodeBinding,
    const XrSpatialGraphNodeBindingPropertiesGetInfoMSFT* getInfo,
    XrSpatialGraphNodeBindingPropertiesMSFT* properties) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_spatialgraphnodebindingmsft_dispatch_mutex);
            auto map_iter = g_spatialgraphnodebindingmsft_dispatch_map.find(nodeBinding);
            if (map_iter == g_spatialgraphnodebindingmsft_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrGetSpatialGraphNodeBindingPropertiesMSFT", "");
        std::ostringstream oss_nodeBinding;
        oss_nodeBinding << std::hex << reinterpret_cast<const void*>(nodeBinding);
        contents.emplace_back("XrSpatialGraphNodeBindingMSFT", "nodeBinding", oss_nodeBinding.str());
        if (nullptr == getInfo) {
            std::ostringstream oss_getInfo;
            oss_getInfo << std::hex << reinterpret_cast<const void*>(getInfo);
            contents.emplace_back("const XrSpatialGraphNodeBindingPropertiesGetInfoMSFT*", "getInfo", oss_getInfo.str());
        } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, getInfo, "getInfo", "const XrSpatialGraphNodeBindingPropertiesGetInfoMSFT*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_properties;
        oss_properties << std::hex << reinterpret_cast<const void*>(properties);
        contents.emplace_back("XrSpatialGraphNodeBindingPropertiesMSFT*", "properties", oss_properties.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->GetSpatialGraphNodeBindingPropertiesMSFT(nodeBinding, getInfo, properties);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}